

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O2

void resize_reset_rc(AV1_COMP *cpi,int resize_width,int resize_height,int prev_width,int prev_height
                    )

{
  AV1_PRIMARY *pAVar1;
  int64_t iVar2;
  LAYER_CONTEXT *pLVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  double dVar8;
  
  pAVar1 = cpi->ppi;
  (cpi->svc).skip_mvsearch_last = 0;
  (cpi->svc).skip_mvsearch_gf = 0;
  (cpi->svc).skip_mvsearch_altref = 0;
  dVar8 = (double)(resize_height * resize_width) / (double)(prev_width * prev_height);
  iVar2 = (pAVar1->p_rc).optimal_buffer_level;
  (pAVar1->p_rc).buffer_level = iVar2;
  (pAVar1->p_rc).bits_off_target = iVar2;
  iVar4 = av1_calc_pframe_target_size_one_pass_cbr(cpi,'\x01');
  (cpi->rc).this_frame_target = iVar4;
  if (dVar8 <= 4.0) {
    if (dVar8 <= 1.0) goto LAB_009382b3;
    iVar5 = (cpi->rc).worst_quality + (pAVar1->p_rc).avg_frame_qindex[1] >> 1;
  }
  else {
    iVar5 = (cpi->rc).worst_quality;
  }
  (pAVar1->p_rc).avg_frame_qindex[1] = iVar5;
LAB_009382b3:
  iVar5 = calc_active_worst_quality_no_stats_cbr(cpi);
  iVar4 = av1_rc_regulate_q(cpi,iVar4,(cpi->rc).best_quality,iVar5,resize_width,resize_height);
  if ((dVar8 < 1.0) && (((cpi->rc).worst_quality * 0x5a) / 100 < iVar4)) {
    (pAVar1->p_rc).rate_correction_factors[0] = (pAVar1->p_rc).rate_correction_factors[0] * 0.85;
  }
  if (1.0 <= dVar8) {
    iVar5 = (pAVar1->p_rc).last_q[1];
    if ((dVar8 < 4.0) && ((iVar5 * 0x82) / 100 < iVar4)) {
      (pAVar1->p_rc).rate_correction_factors[0] = (pAVar1->p_rc).rate_correction_factors[0] * 0.8;
    }
    if (iVar4 <= (iVar5 * 0x78) / 100) {
      (pAVar1->p_rc).rate_correction_factors[0] = (pAVar1->p_rc).rate_correction_factors[0] * 1.5;
    }
  }
  iVar4 = (cpi->svc).number_temporal_layers;
  if (1 < iVar4) {
    for (lVar6 = 0; (int)lVar6 < iVar4; lVar6 = lVar6 + 1) {
      pLVar3 = (cpi->svc).layer_context;
      lVar7 = (long)iVar4 * (long)(cpi->svc).spatial_layer_id + lVar6;
      pLVar3[lVar7].rc.resize_state = (cpi->rc).resize_state;
      iVar2 = pLVar3[lVar7].p_rc.optimal_buffer_level;
      pLVar3[lVar7].p_rc.buffer_level = iVar2;
      pLVar3[lVar7].p_rc.bits_off_target = iVar2;
      pLVar3[lVar7].p_rc.rate_correction_factors[0] = (pAVar1->p_rc).rate_correction_factors[0];
      pLVar3[lVar7].p_rc.avg_frame_qindex[1] = (pAVar1->p_rc).avg_frame_qindex[1];
      iVar4 = (cpi->svc).number_temporal_layers;
    }
  }
  return;
}

Assistant:

static void resize_reset_rc(AV1_COMP *cpi, int resize_width, int resize_height,
                            int prev_width, int prev_height) {
  RATE_CONTROL *const rc = &cpi->rc;
  PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  SVC *const svc = &cpi->svc;
  int target_bits_per_frame;
  int active_worst_quality;
  int qindex;
  double tot_scale_change = (double)(resize_width * resize_height) /
                            (double)(prev_width * prev_height);
  // Disable the skip mv search for svc on resize frame.
  svc->skip_mvsearch_last = 0;
  svc->skip_mvsearch_gf = 0;
  svc->skip_mvsearch_altref = 0;
  // Reset buffer level to optimal, update target size.
  p_rc->buffer_level = p_rc->optimal_buffer_level;
  p_rc->bits_off_target = p_rc->optimal_buffer_level;
  rc->this_frame_target =
      av1_calc_pframe_target_size_one_pass_cbr(cpi, INTER_FRAME);
  target_bits_per_frame = rc->this_frame_target;
  if (tot_scale_change > 4.0)
    p_rc->avg_frame_qindex[INTER_FRAME] = rc->worst_quality;
  else if (tot_scale_change > 1.0)
    p_rc->avg_frame_qindex[INTER_FRAME] =
        (p_rc->avg_frame_qindex[INTER_FRAME] + rc->worst_quality) >> 1;
  active_worst_quality = calc_active_worst_quality_no_stats_cbr(cpi);
  qindex = av1_rc_regulate_q(cpi, target_bits_per_frame, rc->best_quality,
                             active_worst_quality, resize_width, resize_height);
  // If resize is down, check if projected q index is close to worst_quality,
  // and if so, reduce the rate correction factor (since likely can afford
  // lower q for resized frame).
  if (tot_scale_change < 1.0 && qindex > 90 * rc->worst_quality / 100)
    p_rc->rate_correction_factors[INTER_NORMAL] *= 0.85;
  // If resize is back up: check if projected q index is too much above the
  // previous index, and if so, reduce the rate correction factor
  // (since prefer to keep q for resized frame at least closet to previous q).
  // Also check if projected qindex is close to previous qindex, if so
  // increase correction factor (to push qindex higher and avoid overshoot).
  if (tot_scale_change >= 1.0) {
    if (tot_scale_change < 4.0 &&
        qindex > 130 * p_rc->last_q[INTER_FRAME] / 100)
      p_rc->rate_correction_factors[INTER_NORMAL] *= 0.8;
    if (qindex <= 120 * p_rc->last_q[INTER_FRAME] / 100)
      p_rc->rate_correction_factors[INTER_NORMAL] *= 1.5;
  }
  if (svc->number_temporal_layers > 1) {
    // Apply the same rate control reset to all temporal layers.
    for (int tl = 0; tl < svc->number_temporal_layers; tl++) {
      LAYER_CONTEXT *lc = NULL;
      lc = &svc->layer_context[svc->spatial_layer_id *
                                   svc->number_temporal_layers +
                               tl];
      lc->rc.resize_state = rc->resize_state;
      lc->p_rc.buffer_level = lc->p_rc.optimal_buffer_level;
      lc->p_rc.bits_off_target = lc->p_rc.optimal_buffer_level;
      lc->p_rc.rate_correction_factors[INTER_NORMAL] =
          p_rc->rate_correction_factors[INTER_NORMAL];
      lc->p_rc.avg_frame_qindex[INTER_FRAME] =
          p_rc->avg_frame_qindex[INTER_FRAME];
    }
  }
}